

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O3

SUNErrCode SUNHashMap_Destroy(SUNHashMap *map,_func_void_void_ptr *freevalue)

{
  SUNHashMapKeyValue __ptr;
  SUNHashMap __ptr_00;
  long lVar1;
  
  if (freevalue == (_func_void_void_ptr *)0x0 || map == (SUNHashMap *)0x0) {
    return 0;
  }
  __ptr_00 = *map;
  if (0 < __ptr_00->max_size) {
    lVar1 = 0;
    do {
      __ptr = __ptr_00->buckets[lVar1];
      if (__ptr != (SUNHashMapKeyValue)0x0) {
        if (__ptr->value != (void *)0x0) {
          (*freevalue)(__ptr->value);
          __ptr_00 = *map;
          __ptr = __ptr_00->buckets[lVar1];
          if (__ptr == (SUNHashMapKeyValue)0x0) goto LAB_00107558;
        }
        free(__ptr);
        __ptr_00 = *map;
      }
LAB_00107558:
      lVar1 = lVar1 + 1;
    } while (lVar1 < __ptr_00->max_size);
  }
  if (__ptr_00->buckets != (SUNHashMapKeyValue *)0x0) {
    free(__ptr_00->buckets);
    __ptr_00 = *map;
    if (__ptr_00 == (SUNHashMap)0x0) goto LAB_00107582;
  }
  free(__ptr_00);
LAB_00107582:
  *map = (SUNHashMap)0x0;
  return 0;
}

Assistant:

SUNErrCode SUNHashMap_Destroy(SUNHashMap* map, void (*freevalue)(void* ptr))
{
  int i;

  if (map == NULL || freevalue == NULL) { return SUN_SUCCESS; }

  for (i = 0; i < (*map)->max_size; i++)
  {
    if ((*map)->buckets[i] && (*map)->buckets[i]->value)
    {
      freevalue((*map)->buckets[i]->value);
    }

    if ((*map)->buckets[i]) { free((*map)->buckets[i]); }
  }
  if ((*map)->buckets) { free((*map)->buckets); }
  if (*map) { free(*map); }
  *map = NULL;

  return SUN_SUCCESS;
}